

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::accumulateScaleFactors
          (BeagleCPUImpl<float,_1,_0> *this,int *scalingIndices,int count,int cumulativeScalingIndex
          )

{
  long lVar1;
  long lVar2;
  int in_ECX;
  int iVar3;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar6 [16];
  int j_2;
  float *scaleBuffer_1;
  int i_1;
  float *cumulativeScaleBuffer_1;
  int j_1;
  short *scaleBuffer;
  int sIndex;
  int i;
  int j;
  float *cumulativeScaleBuffer;
  undefined4 local_5c;
  undefined4 local_4c;
  undefined4 local_3c;
  undefined4 local_28;
  undefined4 local_24;
  
  if ((*(ulong *)(in_RDI + 0x58) & 0x80) == 0) {
    lVar1 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)in_ECX * 8);
    for (local_4c = 0; local_4c < in_EDX; local_4c = local_4c + 1) {
      lVar2 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)*(int *)(in_RSI + (long)local_4c * 4) * 8);
      for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x14); local_5c = local_5c + 1) {
        if ((*(ulong *)(in_RDI + 0x58) & 0x400) == 0) {
          dVar4 = log((double)*(float *)(lVar2 + (long)local_5c * 4));
          *(float *)(lVar1 + (long)local_5c * 4) =
               (float)((double)*(float *)(lVar1 + (long)local_5c * 4) + dVar4);
        }
        else {
          *(float *)(lVar1 + (long)local_5c * 4) =
               *(float *)(lVar2 + (long)local_5c * 4) + *(float *)(lVar1 + (long)local_5c * 4);
        }
      }
    }
  }
  else {
    lVar1 = **(long **)(in_RDI + 0xb8);
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x14); local_24 = local_24 + 1) {
      in_ZMM0 = ZEXT1664((undefined1  [16])0x0);
      *(undefined4 *)(lVar1 + (long)local_24 * 4) = 0;
    }
    for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
      iVar3 = *(int *)(in_RSI + (long)local_28 * 4) - *(int *)(in_RDI + 0x10);
      if (*(int *)(*(long *)(in_RDI + 200) + (long)iVar3 * 4) != 0) {
        lVar2 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)iVar3 * 8);
        for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x14); local_3c = local_3c + 1) {
          auVar5._0_8_ = (double)(int)*(short *)(lVar2 + (long)local_3c * 2);
          auVar5._8_8_ = in_ZMM0._8_8_;
          auVar6._0_8_ = (double)*(float *)(lVar1 + (long)local_3c * 4);
          auVar6._8_8_ = in_ZMM1._8_8_;
          auVar6 = vfmadd213sd_fma(ZEXT816(0x3fe62e42fefa39ef),auVar5,auVar6);
          in_ZMM1 = ZEXT1664(auVar6);
          in_ZMM0 = ZEXT1664(CONCAT124(auVar5._4_12_,(float)auVar6._0_8_));
          *(float *)(lVar1 + (long)local_3c * 4) = (float)auVar6._0_8_;
        }
      }
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateScaleFactors(const int* scalingIndices,
                                                int  count,
                                                int  cumulativeScalingIndex) {
    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[0];
        for(int j=0; j<kPatternCount; j++)
            cumulativeScaleBuffer[j] =  0;
        for(int i=0; i<count; i++) {
            int sIndex = scalingIndices[i] - kTipCount;
            if (gActiveScalingFactors[sIndex]) {
                const signed short* scaleBuffer = gAutoScaleBuffers[sIndex];
                for(int j=0; j<kPatternCount; j++) {
                    cumulativeScaleBuffer[j] += M_LN2 * scaleBuffer[j];
                }
            }
        }

    } else {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
        for(int i=0; i<count; i++) {
            const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
            for(int j=0; j<kPatternCount; j++) {
                if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                    cumulativeScaleBuffer[j] += scaleBuffer[j];
                else
                    cumulativeScaleBuffer[j] += log(scaleBuffer[j]);
            }
        }

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr,"Accumulating %d scale buffers into #%d\n",count,cumulativeScalingIndex);
            for(int j=0; j<kPatternCount; j++) {
                fprintf(stderr,"cumulativeScaleBuffer[%d] = %2.5e\n",j,cumulativeScaleBuffer[j]);
            }
        }
    }

    return BEAGLE_SUCCESS;
}